

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.c
# Opt level: O0

void erase_ref(h2o_cache_t *cache,khiter_t iter,int reuse)

{
  h2o_cache_ref_t *ref_00;
  h2o_cache_ref_t *ref;
  int reuse_local;
  khiter_t iter_local;
  h2o_cache_t *cache_local;
  
  ref_00 = cache->table->keys[iter];
  if (reuse == 0) {
    kh_del_cache(cache->table,iter);
  }
  h2o_linklist_unlink(&ref_00->_lru_link);
  h2o_linklist_unlink(&ref_00->_age_link);
  cache->size = cache->size - (ref_00->value).len;
  h2o_cache_release(cache,ref_00);
  return;
}

Assistant:

static void erase_ref(h2o_cache_t *cache, khiter_t iter, int reuse)
{
    h2o_cache_ref_t *ref = kh_key(cache->table, iter);

    if (!reuse)
        kh_del(cache, cache->table, iter);
    h2o_linklist_unlink(&ref->_lru_link);
    h2o_linklist_unlink(&ref->_age_link);
    cache->size -= ref->value.len;

    h2o_cache_release(cache, ref);
}